

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

IDiagObjectAddress * __thiscall
Js::DiagScopeVariablesWalker::FindPropertyAddress
          (DiagScopeVariablesWalker *this,PropertyId propId,bool *isConst)

{
  Type pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  IDiagObjectAddress *pIVar5;
  undefined4 *puVar6;
  Type *ppIVar7;
  undefined4 extraout_var;
  int index;
  
  GetChildrenCount(this);
  pIVar5 = (IDiagObjectAddress *)0x0;
  if (this->pDiagScopeObjects !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    index = 0;
    do {
      if ((this->pDiagScopeObjects->
          super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count <= index) {
        return (IDiagObjectAddress *)0x0;
      }
      ppIVar7 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pDiagScopeObjects,index);
      pIVar1 = *ppIVar7;
      if (pIVar1 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x418,"(pObjWalker)","pObjWalker");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[3])(pIVar1,(ulong)(uint)propId,isConst);
      pIVar5 = (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
      index = index + 1;
    } while (pIVar5 == (IDiagObjectAddress *)0x0);
  }
  return pIVar5;
}

Assistant:

IDiagObjectAddress * DiagScopeVariablesWalker::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        IDiagObjectAddress * address = nullptr;

        // Ensure that children are fetched.
        GetChildrenCount();

        if (pDiagScopeObjects)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                Assert(pObjWalker);

                address = pObjWalker->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    break;
                }
            }
        }

        return address;
    }